

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastVerify.cpp
# Opt level: O0

void cast_verify::TestDouble(void)

{
  ostream *poVar1;
  bool fSuccess;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  test;
  uint i;
  CastTest<double> tests [5];
  double *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_68;
  uint local_5c;
  byte abStack_50 [80];
  
  InitializeCastArray<double>
            ((CastTest<double> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (size_t)in_stack_ffffffffffffff88);
  for (local_5c = 0; local_5c < 5; local_5c = local_5c + 1) {
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_68);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
              in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff97 = 1;
    if ((abStack_50[(ulong)local_5c * 0x10] & 1) != 1) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Error in cast double to std::uint64_t case ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_5c);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void TestDouble()
	{
		CastTest<double> tests[5];

		InitializeCastArray(tests, _countof(tests));

		for (unsigned i = 0; i < _countof(tests); ++i)
		{
			SafeInt<std::uint64_t> test;
			bool fSuccess;

			try
			{
				test = tests[i].x;
				fSuccess = true;
			}
			catch (...)
			{
				fSuccess = false;
			}

			if(fSuccess != tests[i].fExpected)
				std::cerr << "Error in cast double to std::uint64_t case " << i << std::endl;
		}
	}